

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_HeartGenerator.h
# Opt level: O1

void __thiscall soul::HEARTGenerator::visit(HEARTGenerator *this,LoopStatement *l)

{
  FunctionBuilder *this_00;
  uint index;
  uint32_t uVar1;
  VariableDeclaration *this_01;
  Expression *pEVar2;
  Variable *pVVar3;
  _func_int **pp_Var4;
  char cVar5;
  char cVar6;
  bool bVar7;
  int iVar8;
  Structure *pSVar9;
  int64_t iVar10;
  long *plVar11;
  Variable *pVVar12;
  Expression *pEVar13;
  Constant *pCVar14;
  BinaryOperator *pBVar15;
  undefined4 extraout_var;
  size_type *psVar16;
  uint uVar17;
  StructurePtr SVar18;
  Type type;
  pool_ptr<soul::AST::Constant> constNumIterations;
  Type local_248;
  undefined1 local_230 [16];
  StructurePtr SStack_220;
  StructurePtr local_210;
  Block *local_208;
  Structure *local_200;
  Block *local_1f8;
  int32_t local_1ec;
  CodeLocation local_1e8;
  CodeLocation local_1d8;
  Block *local_1c8;
  Block *local_1c0;
  string local_1b8;
  long local_198;
  string local_190;
  Type local_170;
  Type local_158;
  pool_ptr<soul::heart::Block> local_140;
  pool_ptr<soul::heart::Block> local_138;
  pool_ptr<soul::heart::Block> local_130;
  pool_ptr<soul::heart::Block> local_128;
  pool_ptr<soul::heart::Block> local_120;
  pool_ptr<soul::heart::Block> local_118;
  pool_ptr<soul::heart::Block> local_110;
  pool_ptr<soul::heart::Block> local_108;
  pool_ptr<soul::heart::Block> local_100;
  pool_ptr<soul::heart::Block> local_f8;
  pool_ptr<soul::heart::Block> local_f0;
  pool_ptr<soul::heart::Block> local_e8;
  Value local_e0;
  CompileMessage local_a0;
  CompileMessage local_68;
  
  index = this->loopIndex;
  this->loopIndex = index + 1;
  local_1c0 = (this->breakTarget).object;
  local_1c8 = (this->continueTarget).object;
  this_00 = &this->builder;
  pSVar9 = (Structure *)FunctionBuilder::createBlock(this_00,"@break_",index);
  local_1f8 = FunctionBuilder::createBlock(this_00,"@cont_",index);
  (this->breakTarget).object = (Block *)pSVar9;
  (this->continueTarget).object = local_1f8;
  local_210.object = pSVar9;
  local_208 = FunctionBuilder::createBlock(this_00,"@loop_",index);
  pSVar9 = (Structure *)FunctionBuilder::createBlock(this_00,"@body_",index);
  this_01 = (l->rangeLoopInitialiser).object;
  if (this_01 == (VariableDeclaration *)0x0) {
    pEVar2 = (l->numIterations).object;
    if (pEVar2 == (Expression *)0x0) {
      local_118.object = local_208;
      FunctionBuilder::beginBlock(this_00,&local_118);
      pEVar2 = (l->condition).object;
      if (pEVar2 == (Expression *)0x0) {
        local_120.object = (Block *)pSVar9;
        FunctionBuilder::addBranch(this_00,(Block *)pSVar9,&local_120);
      }
      else {
        (*(pEVar2->super_Statement).super_ASTObject._vptr_ASTObject[0xd])(&local_248);
        if (local_248._0_8_ == 0) {
          pEVar2 = (l->condition).object;
          if (pEVar2 == (Expression *)0x0) {
            throwInternalCompilerError("object != nullptr","operator*",0x3b);
          }
          local_130.object = (Block *)pSVar9;
          addBranchIf(this,pEVar2,(Block *)pSVar9,(Block *)local_210.object,&local_130);
        }
        else {
          soul::Value::getData((PackedData *)local_230,(Value *)(local_248._0_8_ + 0x30));
          bVar7 = soul::Value::PackedData::getAsBool((PackedData *)local_230);
          SVar18.object = local_210.object;
          if (bVar7) {
            SVar18.object = pSVar9;
          }
          local_128.object = (Block *)pSVar9;
          FunctionBuilder::addBranch(this_00,(Block *)SVar18.object,&local_128);
        }
      }
      if ((l->body).object != (Statement *)0x0) {
        pp_Var4 = (this->super_ASTVisitor)._vptr_ASTVisitor;
        pVVar12 = (this->currentTargetVariable).object;
        uVar1 = this->expressionDepth;
        (this->currentTargetVariable).object = (Variable *)0x0;
        this->expressionDepth = 0;
        (*pp_Var4[4])(this);
        (this->currentTargetVariable).object = pVVar12;
        this->expressionDepth = uVar1;
      }
      local_138.object = local_1f8;
      FunctionBuilder::beginBlock(this_00,&local_138);
      if ((l->iterator).object != (Statement *)0x0) {
        pp_Var4 = (this->super_ASTVisitor)._vptr_ASTVisitor;
        pVVar12 = (this->currentTargetVariable).object;
        uVar1 = this->expressionDepth;
        (this->currentTargetVariable).object = (Variable *)0x0;
        this->expressionDepth = 0;
        (*pp_Var4[4])(this);
        (this->currentTargetVariable).object = pVVar12;
        this->expressionDepth = uVar1;
      }
    }
    else {
      if ((l->condition).object != (Expression *)0x0 || (l->iterator).object != (Statement *)0x0) {
        throwInternalCompilerError("l.iterator == nullptr && l.condition == nullptr","visit",0x33a);
      }
      (*(pEVar2->super_Statement).super_ASTObject._vptr_ASTObject[4])(&local_248);
      if ((1 < local_248.primitiveType.type - int32) || (local_248.category != primitive)) {
        pEVar2 = (l->numIterations).object;
        if (pEVar2 == (Expression *)0x0) {
          throwInternalCompilerError("object != nullptr","operator->",0x3c);
        }
        CompileMessageHelpers::createMessage<>(&local_a0,syntax,error,"Expected an integer");
        AST::Context::throwError(&(pEVar2->super_Statement).super_ASTObject.context,&local_a0,false)
        ;
      }
      if (local_248.primitiveType.type == int64) {
        pEVar2 = (l->numIterations).object;
        if (pEVar2 == (Expression *)0x0) {
          throwInternalCompilerError("object != nullptr","operator->",0x3c);
        }
        (*(pEVar2->super_Statement).super_ASTObject._vptr_ASTObject[0xd])(&local_198);
        if (local_198 != 0) {
          soul::Value::getData((PackedData *)local_230,(Value *)(local_198 + 0x30));
          iVar10 = soul::Value::PackedData::getAsInt64((PackedData *)local_230);
          SVar18.object = local_248.structure.object;
          if (iVar10 < 0x80000000) {
            local_248.category = primitive;
            local_248.arrayElementCategory = invalid;
            local_248.isRef = false;
            local_248.isConstant = false;
            local_248.primitiveType.type = int32;
            local_248.boundingSize = 0;
            local_248.arrayElementBoundingSize = 0;
            if (local_248.structure.object != (Structure *)0x0) {
              local_248.structure.object = (Structure *)0x0;
              RefCountedPtr<soul::Structure>::decIfNotNull(SVar18.object);
            }
            RefCountedPtr<soul::Structure>::decIfNotNull((Structure *)0x0);
          }
        }
      }
      local_170.category = local_248.category;
      local_170.arrayElementCategory = local_248.arrayElementCategory;
      local_170.isRef = local_248.isRef;
      local_170.isConstant = local_248.isConstant;
      local_170.primitiveType.type = local_248.primitiveType.type;
      local_170.boundingSize = local_248.boundingSize;
      local_170.arrayElementBoundingSize = local_248.arrayElementBoundingSize;
      local_170.structure.object = local_248.structure.object;
      if (local_248.structure.object != (Structure *)0x0) {
        ((local_248.structure.object)->super_RefCountedObject).refCount =
             ((local_248.structure.object)->super_RefCountedObject).refCount + 1;
      }
      cVar6 = '\x01';
      if (9 < index) {
        uVar17 = index;
        cVar5 = '\x04';
        do {
          cVar6 = cVar5;
          if (uVar17 < 100) {
            cVar6 = cVar6 + -2;
            goto LAB_0021e89e;
          }
          if (uVar17 < 1000) {
            cVar6 = cVar6 + -1;
            goto LAB_0021e89e;
          }
          if (uVar17 < 10000) goto LAB_0021e89e;
          bVar7 = 99999 < uVar17;
          uVar17 = uVar17 / 10000;
          cVar5 = cVar6 + '\x04';
        } while (bVar7);
        cVar6 = cVar6 + '\x01';
      }
LAB_0021e89e:
      local_230._0_8_ = (Type *)&SStack_220;
      local_200 = pSVar9;
      std::__cxx11::string::_M_construct((ulong)local_230,cVar6);
      std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_230._0_8_,local_230._8_4_,index)
      ;
      plVar11 = (long *)std::__cxx11::string::replace((ulong)local_230,0,(char *)0x0,0x28841d);
      psVar16 = (size_type *)(plVar11 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar11 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar16) {
        local_1b8.field_2._M_allocated_capacity = *psVar16;
        local_1b8.field_2._8_8_ = plVar11[3];
        local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
      }
      else {
        local_1b8.field_2._M_allocated_capacity = *psVar16;
        local_1b8._M_dataplus._M_p = (pointer)*plVar11;
      }
      local_1b8._M_string_length = plVar11[1];
      *plVar11 = (long)psVar16;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      pVVar12 = BlockBuilder::createMutableLocalVariable
                          (&this_00->super_BlockBuilder,&local_170,&local_1b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
        operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
      }
      if ((Type *)local_230._0_8_ != (Type *)&SStack_220) {
        operator_delete((void *)local_230._0_8_,
                        (ulong)((long)&((SStack_220.object)->super_RefCountedObject).refCount + 1));
      }
      RefCountedPtr<soul::Structure>::decIfNotNull(local_170.structure.object);
      pEVar2 = (l->numIterations).object;
      if (pEVar2 == (Expression *)0x0) {
        throwInternalCompilerError("object != nullptr","operator*",0x3b);
      }
      pEVar13 = evaluateAsExpression(this,pEVar2);
      pEVar13 = BlockBuilder::createCastIfNeeded
                          ((this->builder).super_BlockBuilder.module,pEVar13,&local_248);
      BlockBuilder::addAssignment(&this_00->super_BlockBuilder,&pVVar12->super_Expression,pEVar13);
      local_100.object = local_208;
      FunctionBuilder::beginBlock(this_00,&local_100);
      local_1e8.sourceCode.object =
           (l->super_Statement).super_ASTObject.context.location.sourceCode.object;
      if (local_1e8.sourceCode.object != (SourceCodeText *)0x0) {
        ((local_1e8.sourceCode.object)->super_RefCountedObject).refCount =
             ((local_1e8.sourceCode.object)->super_RefCountedObject).refCount + 1;
      }
      local_1e8.location.data = (l->super_Statement).super_ASTObject.context.location.location.data;
      pCVar14 = heart::Allocator::allocateZeroInitialiser
                          (((this->builder).super_BlockBuilder.module)->allocator,&local_248);
      local_230._0_4_ = 0xe;
      pBVar15 = PoolAllocator::
                allocate<soul::heart::BinaryOperator,soul::CodeLocation,soul::heart::Expression&,soul::heart::Expression&,soul::BinaryOp::Op&>
                          (&((this->builder).super_BlockBuilder.module)->allocator->pool,&local_1e8,
                           &pVVar12->super_Expression,&pCVar14->super_Expression,(Op *)local_230);
      RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_1e8.sourceCode.object);
      local_108.object = (Block *)local_200;
      FunctionBuilder::addBranchIf
                (this_00,&pBVar15->super_Expression,(Block *)local_200,(Block *)local_210.object,
                 &local_108);
      if ((l->body).object != (Statement *)0x0) {
        pp_Var4 = (this->super_ASTVisitor)._vptr_ASTVisitor;
        pVVar3 = (this->currentTargetVariable).object;
        uVar1 = this->expressionDepth;
        (this->currentTargetVariable).object = (Variable *)0x0;
        this->expressionDepth = 0;
        (*pp_Var4[4])(this);
        (this->currentTargetVariable).object = pVVar3;
        this->expressionDepth = uVar1;
      }
      local_110.object = local_1f8;
      FunctionBuilder::beginBlock(this_00,&local_110);
      pEVar13 = BlockBuilder::createIntegerChangedByOne
                          (&this_00->super_BlockBuilder,&pVVar12->super_Expression,subtract);
      BlockBuilder::addAssignment(&this_00->super_BlockBuilder,&pVVar12->super_Expression,pEVar13);
      RefCountedPtr<soul::Structure>::decIfNotNull(local_248.structure.object);
    }
  }
  else {
    if ((l->condition).object != (Expression *)0x0 || (l->iterator).object != (Statement *)0x0) {
      throwInternalCompilerError("l.iterator == nullptr && l.condition == nullptr","visit",799);
    }
    AST::VariableDeclaration::getType(&local_248,this_01);
    if ((local_248.category & ~primitive) != wrap) {
      CompileMessageHelpers::createMessage<>
                (&local_68,syntax,error,
                 "A range-based-for loop must declare a variable with a \'wrap\' type");
      AST::Context::throwError(&(this_01->super_Statement).super_ASTObject.context,&local_68,false);
    }
    local_1ec = local_248.boundingSize;
    local_158.category = primitive;
    local_158.arrayElementCategory = invalid;
    local_158.isRef = false;
    local_158.isConstant = false;
    local_158.primitiveType.type = int32;
    local_158.boundingSize = 0;
    local_158.arrayElementBoundingSize = 0;
    local_158.structure.object = (Structure *)0x0;
    cVar6 = '\x01';
    if (9 < index) {
      uVar17 = index;
      cVar5 = '\x04';
      do {
        cVar6 = cVar5;
        if (uVar17 < 100) {
          cVar6 = cVar6 + -2;
          goto LAB_0021e527;
        }
        if (uVar17 < 1000) {
          cVar6 = cVar6 + -1;
          goto LAB_0021e527;
        }
        if (uVar17 < 10000) goto LAB_0021e527;
        bVar7 = 99999 < uVar17;
        uVar17 = uVar17 / 10000;
        cVar5 = cVar6 + '\x04';
      } while (bVar7);
      cVar6 = cVar6 + '\x01';
    }
LAB_0021e527:
    local_230._0_8_ = &SStack_220;
    local_200 = pSVar9;
    std::__cxx11::string::_M_construct((ulong)local_230,cVar6);
    std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_230._0_8_,local_230._8_4_,index);
    plVar11 = (long *)std::__cxx11::string::replace((ulong)local_230,0,(char *)0x0,0x28841d);
    psVar16 = (size_type *)(plVar11 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar11 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar16) {
      local_190.field_2._M_allocated_capacity = *psVar16;
      local_190.field_2._8_8_ = plVar11[3];
      local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
    }
    else {
      local_190.field_2._M_allocated_capacity = *psVar16;
      local_190._M_dataplus._M_p = (pointer)*plVar11;
    }
    local_190._M_string_length = plVar11[1];
    *plVar11 = (long)psVar16;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    pVVar12 = BlockBuilder::createMutableLocalVariable
                        (&this_00->super_BlockBuilder,&local_158,&local_190);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_190._M_dataplus._M_p != &local_190.field_2) {
      operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
    }
    if ((Type *)local_230._0_8_ != (Type *)&SStack_220) {
      operator_delete((void *)local_230._0_8_,
                      (ulong)((long)&((SStack_220.object)->super_RefCountedObject).refCount + 1));
    }
    RefCountedPtr<soul::Structure>::decIfNotNull(local_158.structure.object);
    if ((this_01->initialValue).object == (Expression *)0x0) {
      BlockBuilder::addZeroAssignment(&this_00->super_BlockBuilder,&pVVar12->super_Expression);
    }
    else {
      pVVar3 = (this_01->generatedVariable).object;
      if (pVVar3 == (Variable *)0x0) {
        throwInternalCompilerError("object != nullptr","operator*",0x3b);
      }
      local_230._0_8_ = (Type *)0x700000001;
      local_230._8_8_ = (uint8_t *)0x0;
      SStack_220.object = (Structure *)0x0;
      pEVar13 = BlockBuilder::createCastIfNeeded
                          ((this->builder).super_BlockBuilder.module,&pVVar3->super_Expression,
                           (Type *)local_230);
      BlockBuilder::addAssignment(&this_00->super_BlockBuilder,&pVVar12->super_Expression,pEVar13);
      RefCountedPtr<soul::Structure>::decIfNotNull(SStack_220.object);
    }
    local_e8.object = local_208;
    FunctionBuilder::beginBlock(this_00,&local_e8);
    local_1d8.sourceCode.object =
         (l->super_Statement).super_ASTObject.context.location.sourceCode.object;
    if (local_1d8.sourceCode.object != (SourceCodeText *)0x0) {
      ((local_1d8.sourceCode.object)->super_RefCountedObject).refCount =
           ((local_1d8.sourceCode.object)->super_RefCountedObject).refCount + 1;
    }
    local_1d8.location.data = (l->super_Statement).super_ASTObject.context.location.location.data;
    soul::Value::Value(&local_e0,local_1ec);
    pCVar14 = BlockBuilder::createConstant(&this_00->super_BlockBuilder,&local_e0);
    local_230._0_4_ = 0xc;
    pBVar15 = PoolAllocator::
              allocate<soul::heart::BinaryOperator,soul::CodeLocation,soul::heart::Expression&,soul::heart::Expression&,soul::BinaryOp::Op&>
                        (&((this->builder).super_BlockBuilder.module)->allocator->pool,&local_1d8,
                         &pVVar12->super_Expression,&pCVar14->super_Expression,(Op *)local_230);
    soul::Value::~Value(&local_e0);
    RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_1d8.sourceCode.object);
    local_f0.object = (Block *)local_200;
    FunctionBuilder::addBranchIf
              (this_00,&pBVar15->super_Expression,(Block *)local_200,(Block *)local_210.object,
               &local_f0);
    pVVar3 = (this_01->generatedVariable).object;
    if (pVVar3 == (Variable *)0x0) {
      throwInternalCompilerError("object != nullptr","operator*",0x3b);
    }
    iVar8 = (*(pVVar3->super_Expression).super_Object._vptr_Object[2])(pVVar3);
    pEVar13 = BlockBuilder::createCastIfNeeded
                        ((this->builder).super_BlockBuilder.module,&pVVar12->super_Expression,
                         (Type *)CONCAT44(extraout_var,iVar8));
    BlockBuilder::addAssignment(&this_00->super_BlockBuilder,&pVVar3->super_Expression,pEVar13);
    if ((l->body).object != (Statement *)0x0) {
      pp_Var4 = (this->super_ASTVisitor)._vptr_ASTVisitor;
      pVVar3 = (this->currentTargetVariable).object;
      uVar1 = this->expressionDepth;
      (this->currentTargetVariable).object = (Variable *)0x0;
      this->expressionDepth = 0;
      (*pp_Var4[4])(this);
      (this->currentTargetVariable).object = pVVar3;
      this->expressionDepth = uVar1;
    }
    local_f8.object = local_1f8;
    FunctionBuilder::beginBlock(this_00,&local_f8);
    pEVar13 = BlockBuilder::createIntegerChangedByOne
                        (&this_00->super_BlockBuilder,&pVVar12->super_Expression,add);
    BlockBuilder::addAssignment(&this_00->super_BlockBuilder,&pVVar12->super_Expression,pEVar13);
    RefCountedPtr<soul::Structure>::decIfNotNull(local_248.structure.object);
  }
  local_140.object = (Block *)local_210.object;
  FunctionBuilder::addBranch(this_00,local_208,&local_140);
  (this->breakTarget).object = local_1c0;
  (this->continueTarget).object = local_1c8;
  return;
}

Assistant:

void visit (AST::LoopStatement& l) override
    {
        auto labelIndex = loopIndex++;
        auto oldbreakTarget = breakTarget;
        auto oldcontinueTarget = continueTarget;
        auto& breakBlock    = builder.createBlock ("@break_", labelIndex);
        auto& continueBlock = builder.createBlock ("@cont_",  labelIndex);

        breakTarget = breakBlock;
        continueTarget = continueBlock;

        auto& startBlock = builder.createBlock ("@loop_", labelIndex);
        auto& bodyBlock  = builder.createBlock ("@body_", labelIndex);

        if (auto rangeLoopVar = l.rangeLoopInitialiser)
        {
            SOUL_ASSERT (l.iterator == nullptr && l.condition == nullptr);
            auto type = rangeLoopVar->getType();

            if (! type.isBoundedInt())
                rangeLoopVar->context.throwError (Errors::rangeBasedForMustBeWrapType());

            auto numIterations = type.getBoundedIntLimit();
            auto& counterVar = builder.createMutableLocalVariable (Type::getBoundedIntSizeType(), "$counter_" + std::to_string (labelIndex));

            if (auto init = rangeLoopVar->initialValue)
                builder.addAssignment (counterVar, builder.createCastIfNeeded (rangeLoopVar->getGeneratedVariable(), Type::getBoundedIntSizeType()));
            else
                builder.addZeroAssignment (counterVar);

            builder.beginBlock (startBlock);
            auto& isCounterInRange = builder.createBinaryOp (l.context.location, counterVar,
                                                             builder.createConstant (Value (numIterations)),
                                                             BinaryOp::Op::lessThan);
            builder.addBranchIf (isCounterInRange, bodyBlock, breakBlock, bodyBlock);

            builder.addCastOrAssignment (rangeLoopVar->getGeneratedVariable(), counterVar);
            visitAsStatement (l.body);
            builder.beginBlock (continueBlock);
            builder.incrementValue (counterVar);
        }
        else if (l.numIterations != nullptr)
        {
            SOUL_ASSERT (l.iterator == nullptr && l.condition == nullptr);
            auto indexType = l.numIterations->getResultType();

            if (! indexType.isPrimitiveInteger())
                l.numIterations->context.throwError (Errors::expectedInteger());

            if (indexType.isInteger64())
            {
                if (auto constNumIterations = l.numIterations->getAsConstant())
                {
                    auto num = constNumIterations->value.getAsInt64();

                    if (num <= 0x7fffffff)
                        indexType = PrimitiveType::int32;
                }
            }

            auto& counterVar = builder.createMutableLocalVariable (indexType, "$counter_" + std::to_string (labelIndex));
            builder.addAssignment (counterVar, builder.createCastIfNeeded (evaluateAsExpression (*l.numIterations), indexType));

            builder.beginBlock (startBlock);
            auto& isCounterInRange = builder.createBinaryOp (l.context.location, counterVar,
                                                             builder.createZeroInitialiser (indexType),
                                                             BinaryOp::Op::greaterThan);
            builder.addBranchIf (isCounterInRange, bodyBlock, breakBlock, bodyBlock);
            visitAsStatement (l.body);
            builder.beginBlock (continueBlock);
            builder.decrementValue (counterVar);
        }
        else
        {
            builder.beginBlock (startBlock);

            if (l.condition == nullptr)
                builder.addBranch (bodyBlock, bodyBlock);
            else if (auto c = l.condition->getAsConstant())
                builder.addBranch (c->value.getAsBool() ? bodyBlock : breakBlock, bodyBlock);
            else
                addBranchIf (*l.condition, bodyBlock, breakBlock, bodyBlock);

            visitAsStatement (l.body);
            builder.beginBlock (continueBlock);
            visitAsStatement (l.iterator);
        }

        builder.addBranch (startBlock, breakBlock);
        breakTarget = oldbreakTarget;
        continueTarget = oldcontinueTarget;
    }